

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matrix.c
# Opt level: O0

void MatrixDisplay(Matrix_t sMatrix)

{
  int local_20;
  int local_1c;
  int j;
  int i;
  Matrix_t sMatrix_local;
  
  printf("ROW:%d,COLUMN:%d\n",sMatrix._8_8_ & 0xff,sMatrix._8_8_ >> 8 & 0xff);
  for (local_1c = 0; sMatrix_local.pMatrix._0_1_ = sMatrix.row,
      local_1c < (int)(uint)(byte)sMatrix_local.pMatrix; local_1c = local_1c + 1) {
    for (local_20 = 0; sMatrix_local.pMatrix._1_1_ = sMatrix.column,
        local_20 < (int)(uint)sMatrix_local.pMatrix._1_1_; local_20 = local_20 + 1) {
      printf("\t%f",(double)sMatrix.pMatrix
                            [(long)(int)(local_1c * (uint)sMatrix_local.pMatrix._1_1_) +
                             (long)local_20]);
    }
    printf("\n");
  }
  return;
}

Assistant:

void MatrixDisplay(Matrix_t sMatrix)
{
	int i, j;
	printf("ROW:%d,COLUMN:%d\n", sMatrix.row, sMatrix.column);
	for (i = 0; i < sMatrix.row; i++)
	{
		for (j = 0; j < sMatrix.column; j++)
			printf("\t%f", *(sMatrix.pMatrix + i * sMatrix.column + j));
		printf("\n");
	}
}